

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

DrawStyle * __thiscall
CMU462::DynamicScene::Mesh::get_draw_style(Mesh *this,HalfedgeElement *element)

{
  Scene *pSVar1;
  long lVar2;
  
  pSVar1 = (this->super_SceneObject).scene;
  if (pSVar1 != (Scene *)0x0) {
    if ((pSVar1->selected).element == element) {
      lVar2 = 0x1e0;
      goto LAB_00179d70;
    }
    if ((pSVar1->hovered).element == element) {
      lVar2 = 0x1d8;
      goto LAB_00179d70;
    }
  }
  lVar2 = 0x1d0;
LAB_00179d70:
  return *(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar2);
}

Assistant:

DrawStyle *Mesh::get_draw_style( const HalfedgeElement *element ) const
{
   if( scene && element == scene->selected.element )
   {
      return selectedStyle;
   }

   if( scene && element == scene->hovered.element )
   {
      return hoveredStyle;
   }

   return defaultStyle;
}